

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_management.c
# Opt level: O2

void amqp_management_execute_cancel_handler(ASYNC_OPERATION_HANDLE execute_operation)

{
  int iVar1;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  
  if ((ASYNC_OPERATION_HANDLE)execute_operation[6].async_operation_cancel_handler !=
      (ASYNC_OPERATION_HANDLE)0x0) {
    iVar1 = async_operation_cancel
                      ((ASYNC_OPERATION_HANDLE)execute_operation[6].async_operation_cancel_handler);
    if (iVar1 != 0) {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                   ,"amqp_management_execute_cancel_handler",0x47f,1,
                   "Failed cancelling async send operation.");
      }
    }
  }
  iVar1 = singlylinkedlist_remove_if
                    (*(SINGLYLINKEDLIST_HANDLE *)
                      (execute_operation[5].async_operation_cancel_handler + 0x20),
                     remove_pending_amqp_management_operation,execute_operation + 1);
  if (iVar1 != 0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                 ,"amqp_management_execute_cancel_handler",0x485,1,
                 "Failed removing OPERATION_MESSAGE_INSTANCE from pending list");
      return;
    }
  }
  return;
}

Assistant:

static void amqp_management_execute_cancel_handler(ASYNC_OPERATION_HANDLE execute_operation)
{
    OPERATION_MESSAGE_INSTANCE* instance = GET_ASYNC_OPERATION_CONTEXT(OPERATION_MESSAGE_INSTANCE, execute_operation);

    if (instance->send_async_context != NULL)
    {
        if (async_operation_cancel(instance->send_async_context) != 0)
        {
            LogError("Failed cancelling async send operation.");
        }
    }

    if (singlylinkedlist_remove_if(instance->amqp_management->pending_operations, remove_pending_amqp_management_operation, instance) != 0)
    {
        LogError("Failed removing OPERATION_MESSAGE_INSTANCE from pending list");
    }
}